

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::EnableIfAttr::printLeft(EnableIfAttr *this,OutputStream *S)

{
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  EnableIfAttr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28," [enable_if:");
  OutputStream::operator+=(local_18,local_28);
  NodeArray::printWithComma(&this->Conditions,local_18);
  OutputStream::operator+=(local_18,']');
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += " [enable_if:";
    Conditions.printWithComma(S);
    S += ']';
  }